

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest::HasSpanWithComment
          (SourceInfoTest *this,char start_marker,char end_marker,Message *descriptor_proto,
          FieldDescriptor *field,int index,char *expected_leading_comments,
          char *expected_trailing_comments,char *expected_leading_detached_comments)

{
  SooRep *this_00;
  flat_hash_map<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  *c;
  int value;
  int value_00;
  size_t c_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  iterator *piVar7;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,_std::pair<int,_int>_>_>
  ppVar8;
  const_reference piVar9;
  undefined8 extraout_RAX;
  anon_union_8_1_a8a14541_for_iterator_2 aVar10;
  long *plVar11;
  SpanKey *key_1;
  slot_type *psVar12;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar14;
  char *pcVar15;
  undefined4 in_register_0000008c;
  long *__dest;
  slot_type *psVar16;
  iterator iVar17;
  string_view separator;
  node_type old;
  RepeatedField<int> expected_span;
  SpanKey key;
  AssertHelper local_c0;
  Message local_b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_b0;
  AssertHelper local_a8;
  char local_9a;
  char local_99;
  undefined1 local_98 [8];
  anon_union_8_1_a8a14541_for_iterator_2 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  slot_type *psStack_78;
  slot_type *local_70;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_68;
  long local_60;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_58;
  SpanKey local_48;
  
  c = &this->spans_;
  local_9a = end_marker;
  local_99 = start_marker;
  local_48.descriptor_proto = descriptor_proto;
  local_48.field = field;
  local_48.index = index;
  if (start_marker != '\0') {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
    ::
    find_or_prepare_insert<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>::iterator,_bool>
                *)local_98,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                *)c,&local_48);
    aVar10 = local_90;
    if ((bool)aStack_88._M_local_buf[0] != false) {
      piVar7 = (iterator *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
      c_00 = (c->
             super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             ).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
             .settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
      (c->
      super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
      ).
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0xffffffffffffff9c;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)((long)local_90.slot_ + 0x10))->_M_allocated_capacity =
           CONCAT44(local_48._20_4_,local_48.index);
      *(Message **)local_90.slot_ = local_48.descriptor_proto;
      *(FieldDescriptor **)((long)local_90.slot_ + 8) = local_48.field;
      *(undefined8 *)((long)local_90.slot_ + 0x18) = 0;
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_90.slot_ + 0x20))->_M_dataplus)._M_p = (pointer)0x0;
      *(size_type *)((long)local_90.slot_ + 0x28) = 0;
      absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)c,c_00);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
      ::iterator::operator*(piVar7);
      iVar17 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
               ::find<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                           *)c,(key_arg<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                                *)aVar10.slot_);
      bVar3 = absl::lts_20250127::container_internal::operator==
                        ((iterator *)iVar17.ctrl_,(iterator *)iVar17.field_1.slot_);
      if (!bVar3) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfe2,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>, Hash = absl::hash_internal::Hash<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Eq = std::equal_to<google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey>, Alloc = std::allocator<std::pair<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey, std::vector<const google::protobuf::SourceCodeInfo_Location *>>>, Args = <const std::piecewise_construct_t &, std::tuple<const google::protobuf::compiler::(anonymous namespace)::SourceInfoTest::SpanKey &>, std::tuple<>>]"
                     );
      }
    }
    ppVar8 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
             ::
             at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                         *)&this->markers_,&local_99);
    iVar4 = ppVar8->first;
    iVar5 = ppVar8->second;
    ppVar8 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
             ::
             at<char,absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<char,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::pair<int,int>>>>
                         *)&this->markers_,&local_9a);
    value = ppVar8->first;
    value_00 = ppVar8->second;
    local_58.long_rep.elements_int = 0;
    local_58.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
    RepeatedField<int>::Add((RepeatedField<int> *)&local_58.long_rep,iVar4);
    RepeatedField<int>::Add((RepeatedField<int> *)&local_58.long_rep,iVar5);
    if (value != iVar4) {
      RepeatedField<int>::Add((RepeatedField<int> *)&local_58.long_rep,value);
    }
    RepeatedField<int>::Add((RepeatedField<int> *)&local_58.long_rep,value_00);
    __dest = *(long **)((long)aVar10.slot_ + 0x18);
    if (__dest != (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)aVar10.slot_ + 0x20))->_M_dataplus)._M_p) {
      do {
        local_60 = *__dest;
        iVar4 = protobuf::internal::SooRep::size
                          ((SooRep *)&local_58.long_rep,(local_58.long_rep.elements_int & 4) == 0);
        this_00 = (SooRep *)(local_60 + 0x30);
        iVar5 = protobuf::internal::SooRep::size
                          (this_00,(undefined1  [16])
                                   ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                   (undefined1  [16])0x0);
        if (iVar4 == iVar5) {
          iVar4 = protobuf::internal::SooRep::size
                            ((SooRep *)&local_58.long_rep,(local_58.long_rep.elements_int & 4) == 0)
          ;
          if (iVar4 < 1) {
LAB_00a99894:
            if (expected_leading_comments == (char *)0x0) {
              uVar6 = *(uint *)(local_60 + 0x10) & 1;
              local_b8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_b8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,(char)uVar6) ^ 1;
              local_b0.slot_ = (slot_type *)0x0;
              if (uVar6 != 0) {
                paVar14 = &local_b0;
                testing::Message::Message((Message *)&local_c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&local_b8,
                           (AssertionResult *)"location->has_leading_comments()","true","false",
                           (char *)CONCAT44(in_register_0000008c,index));
                field = (FieldDescriptor *)
                        CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc8f,(char *)field);
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_a8);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                if (paVar1 != &aStack_88) {
                  operator_delete(paVar1,aStack_88._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
                }
                aVar13 = local_b0;
                if (local_b0.slot_ != (slot_type *)0x0) goto LAB_00a99b8b;
              }
            }
            else {
              local_b8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_b8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,*(byte *)(local_60 + 0x10)) & 0xffffff01;
              local_b0.slot_ = (slot_type *)0x0;
              if ((*(byte *)(local_60 + 0x10) & 1) == 0) {
                testing::Message::Message((Message *)&local_c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&local_b8,
                           (AssertionResult *)"location->has_leading_comments()","false","true",
                           (char *)CONCAT44(in_register_0000008c,index));
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc91,(char *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]))
                          );
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_a8);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                if (paVar1 != &aStack_88) {
                  operator_delete(paVar1,aStack_88._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
                }
                if (local_b0.slot_ != (slot_type *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0.slot_);
                }
              }
              field = (FieldDescriptor *)(*(ulong *)(local_60 + 0x60) & 0xfffffffffffffffc);
              testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                        ((internal *)local_98,"expected_leading_comments",
                         "location->leading_comments()",&expected_leading_comments,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field)
              ;
              if (local_98[0] == (internal)0x0) {
                testing::Message::Message(&local_b8);
                if (local_90.slot_ == (slot_type *)0x0) {
                  field = (FieldDescriptor *)(anon_var_dwarf_a22956 + 5);
                }
                else {
                  field = *(FieldDescriptor **)local_90.slot_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc92,(char *)field);
                testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if ((long *)CONCAT44(local_b8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_b8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_,
                                                 (uint)local_b8.ss_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl) + 8))();
                }
              }
              if (local_90.slot_ != (slot_type *)0x0) {
                paVar14 = &local_90;
                aVar13 = local_90;
LAB_00a99b8b:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)paVar14,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             aVar13.slot_);
              }
            }
            if (expected_trailing_comments == (char *)0x0) {
              bVar3 = (*(byte *)(local_60 + 0x10) & 2) == 0;
              local_b8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_b8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,bVar3);
              local_b0.slot_ = (slot_type *)0x0;
              if (!bVar3) {
                paVar14 = &local_b0;
                testing::Message::Message((Message *)&local_c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&local_b8,
                           (AssertionResult *)"location->has_trailing_comments()","true","false",
                           (char *)CONCAT44(in_register_0000008c,index));
                field = (FieldDescriptor *)
                        CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc95,(char *)field);
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_a8);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                if (paVar1 != &aStack_88) {
                  operator_delete(paVar1,aStack_88._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
                }
                aVar13 = local_b0;
                if (local_b0.slot_ != (slot_type *)0x0) goto LAB_00a99de1;
              }
            }
            else {
              uVar6 = *(uint *)(local_60 + 0x10) & 2;
              local_b8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ =
                   CONCAT31(local_b8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._1_3_,(char)(uVar6 >> 1));
              local_b0.slot_ = (slot_type *)0x0;
              if (uVar6 == 0) {
                testing::Message::Message((Message *)&local_c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_98,(internal *)&local_b8,
                           (AssertionResult *)"location->has_trailing_comments()","false","true",
                           (char *)CONCAT44(in_register_0000008c,index));
                testing::internal::AssertHelper::AssertHelper
                          (&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc97,(char *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]))
                          );
                testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_a8);
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                if (paVar1 != &aStack_88) {
                  operator_delete(paVar1,aStack_88._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_c0.data_._4_4_,local_c0.data_._0_4_) + 8))();
                }
                if (local_b0.slot_ != (slot_type *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_b0.slot_);
                }
              }
              field = (FieldDescriptor *)(*(ulong *)(local_60 + 0x68) & 0xfffffffffffffffc);
              testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                        ((internal *)local_98,"expected_trailing_comments",
                         "location->trailing_comments()",&expected_trailing_comments,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field)
              ;
              if (local_98[0] == (internal)0x0) {
                testing::Message::Message(&local_b8);
                if (local_90.slot_ == (slot_type *)0x0) {
                  field = (FieldDescriptor *)(anon_var_dwarf_a22956 + 5);
                }
                else {
                  field = *(FieldDescriptor **)local_90.slot_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc98,(char *)field);
                testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if ((long *)CONCAT44(local_b8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_b8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_,
                                                 (uint)local_b8.ss_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl) + 8))();
                }
              }
              if (local_90.slot_ != (slot_type *)0x0) {
                paVar14 = &local_90;
                aVar13 = local_90;
LAB_00a99de1:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)paVar14,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             aVar13.slot_);
              }
            }
            if (expected_leading_detached_comments == (char *)0x0) {
              local_b8.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_4_ = 0;
              local_c0.data_._0_4_ = *(undefined4 *)(local_60 + 0x50);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_98,"0","location->leading_detached_comments_size()",
                         (int *)&local_b8,(int *)&local_c0);
              if (local_98[0] == (internal)0x0) {
                testing::Message::Message(&local_b8);
                if (local_90.slot_ == (slot_type *)0x0) {
                  pcVar15 = anon_var_dwarf_a22956 + 5;
                }
                else {
                  pcVar15 = *(char **)local_90.slot_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc9b,pcVar15);
                testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                if ((long *)CONCAT44(local_b8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_b8.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl._4_4_,
                                                 (uint)local_b8.ss_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl) + 8))();
                }
              }
              if (local_90.slot_ != (slot_type *)0x0) {
                paVar14 = &local_90;
                goto LAB_00a99f85;
              }
            }
            else {
              separator._M_str = (char *)field;
              separator._M_len = (size_t)"\n";
              absl::lts_20250127::strings_internal::
              JoinRange<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        ((string *)local_98,(strings_internal *)(local_60 + 0x48),
                         (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x1,separator);
              testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                        ((internal *)&local_b8,"expected_leading_detached_comments",
                         "absl::StrJoin(location->leading_detached_comments(), \"\\n\")",
                         &expected_leading_detached_comments,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
              if (paVar1 != &aStack_88) {
                operator_delete(paVar1,aStack_88._M_allocated_capacity + 1);
              }
              if (local_b8.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)local_98);
                if (local_b0.slot_ == (slot_type *)0x0) {
                  pcVar15 = anon_var_dwarf_a22956 + 5;
                }
                else {
                  pcVar15 = *(char **)local_b0.slot_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_c0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
                           ,0xc9e,pcVar15);
                testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_98);
                testing::internal::AssertHelper::~AssertHelper(&local_c0);
                plVar2 = (long *)CONCAT62(local_98._2_6_,CONCAT11(local_98[1],local_98[0]));
                if (plVar2 != (long *)0x0) {
                  (**(code **)(*plVar2 + 8))();
                }
              }
              if (local_b0.slot_ != (slot_type *)0x0) {
                paVar14 = &local_b0;
                local_90 = local_b0;
LAB_00a99f85:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)paVar14,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90.slot_);
              }
            }
            plVar2 = __dest + 1;
            plVar11 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)aVar10.slot_ + 0x20))->_M_dataplus)._M_p;
            if (plVar2 != plVar11) {
              memmove(__dest,plVar2,(long)plVar11 - (long)plVar2);
              plVar11 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)aVar10.slot_ + 0x20))->_M_dataplus)._M_p;
            }
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)aVar10.slot_ + 0x20))->_M_dataplus)._M_p = (pointer)(plVar11 + -1);
            bVar3 = true;
            goto LAB_00a99fb1;
          }
          iVar4 = 0;
          while( true ) {
            piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)&local_58.long_rep,iVar4);
            iVar5 = *piVar9;
            piVar9 = RepeatedField<int>::Get((RepeatedField<int> *)this_00,iVar4);
            if (iVar5 != *piVar9) break;
            iVar5 = protobuf::internal::SooRep::size
                              ((SooRep *)&local_58.long_rep,
                               (local_58.long_rep.elements_int & 4) == 0);
            iVar4 = iVar4 + 1;
            if (iVar5 <= iVar4) goto LAB_00a99894;
          }
        }
        __dest = __dest + 1;
      } while (__dest != (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)aVar10.slot_ + 0x20))->_M_dataplus)._M_p);
    }
    bVar3 = false;
LAB_00a99fb1:
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&local_58.long_rep);
    return bVar3;
  }
  iVar17 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
           ::find<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                       *)c,&local_48);
  aVar10 = iVar17.field_1;
  piVar7 = (iterator *)iVar17.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
              *)(this->spans_).
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  bVar3 = absl::lts_20250127::container_internal::operator==(piVar7,(iterator *)aVar10.slot_);
  if (bVar3) {
    local_98[1] = false;
    local_90.slot_ = (slot_type *)0x0;
    aStack_88._M_allocated_capacity = 0;
    aStack_88._8_8_ = (ctrl_t *)0x0;
    psStack_78 = (slot_type *)0x0;
    local_70 = (slot_type *)0x0;
    aStack_68.slot_ = (slot_type *)0x0;
    psVar12 = (slot_type *)0x0;
    psVar16 = (slot_type *)0x0;
LAB_00a99a4b:
    absl::lts_20250127::container_internal::
    node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
    ::~node_handle_base((node_handle_base<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_void>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                         *)local_98);
    return (bool)(psVar16 != psVar12 & ~bVar3);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
              *)(c->
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                ).
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.capacity_);
  if (piVar7 == (iterator *)0x0) {
    compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
  }
  else if (piVar7 != (iterator *)(absl::lts_20250127::container_internal::kEmptyGroup + 0x10)) {
    if (-1 < *(char *)&piVar7->ctrl_) {
      local_98[1] = true;
      local_90 = *(anon_union_8_1_a8a14541_for_iterator_2 *)aVar10.slot_;
      aStack_88._M_allocated_capacity =
           (size_type)*(anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar10.slot_ + 8);
      aStack_88._8_8_ = ((iterator *)((long)aVar10.slot_ + 0x10))->ctrl_;
      psVar16 = ((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar10.slot_ + 0x18))->slot_;
      psVar12 = (slot_type *)((iterator *)((long)aVar10.slot_ + 0x20))->ctrl_;
      aStack_68 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar10.slot_ + 0x28);
      ((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar10.slot_ + 0x18))->slot_ =
           (slot_type *)0x0;
      ((iterator *)((long)aVar10.slot_ + 0x20))->ctrl_ = (ctrl_t *)0x0;
      ((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar10.slot_ + 0x28))->slot_ =
           (slot_type *)0x0;
      psStack_78 = psVar16;
      local_70 = psVar12;
      absl::lts_20250127::container_internal::EraseMetaOnly
                ((CommonFields *)c,
                 (long)piVar7 -
                 (long)(((HeapOrSoo *)
                        ((long)&(this->spans_).
                                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                                .
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::equal_to<google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey>,_std::allocator<std::pair<const_google::protobuf::compiler::(anonymous_namespace)::SourceInfoTest::SpanKey,_std::vector<const_google::protobuf::SourceCodeInfo_Location_*,_std::allocator<const_google::protobuf::SourceCodeInfo_Location_*>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value + 0x10))->heap).control,0x30);
      goto LAB_00a99a4b;
    }
    goto LAB_00a99fd9;
  }
  compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
LAB_00a99fd9:
  compiler::_GLOBAL__N_1::SourceInfoTest::HasSpanWithComment();
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if ((long *)CONCAT44(local_b8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (uint)local_b8.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (uint)local_b8.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl) + 8))();
  }
  if (local_90.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90.slot_
                );
  }
  RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&local_58.long_rep);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool HasSpanWithComment(char start_marker, char end_marker,
                          const Message& descriptor_proto,
                          const FieldDescriptor* field, int index,
                          const char* expected_leading_comments,
                          const char* expected_trailing_comments,
                          const char* expected_leading_detached_comments) {
    SpanKey key(descriptor_proto, field, index);
    if (start_marker == '\0') {
      auto old = spans_.extract(key);
      // Return true if we actually removed something.
      return !(old.empty() || old.mapped().empty());
    }

    std::vector<const SourceCodeInfo::Location*>& range = spans_[key];
    std::pair<int, int> start_pos = markers_.at(start_marker);
    std::pair<int, int> end_pos = markers_.at(end_marker);

    RepeatedField<int> expected_span;
    expected_span.Add(start_pos.first);
    expected_span.Add(start_pos.second);
    if (end_pos.first != start_pos.first) {
      expected_span.Add(end_pos.first);
    }
    expected_span.Add(end_pos.second);

    for (auto iter = range.begin(); iter != range.end(); ++iter) {
      const SourceCodeInfo::Location* location = *iter;
      if (CompareSpans(expected_span, location->span())) {
        if (expected_leading_comments == nullptr) {
          EXPECT_FALSE(location->has_leading_comments());
        } else {
          EXPECT_TRUE(location->has_leading_comments());
          EXPECT_EQ(expected_leading_comments, location->leading_comments());
        }
        if (expected_trailing_comments == nullptr) {
          EXPECT_FALSE(location->has_trailing_comments());
        } else {
          EXPECT_TRUE(location->has_trailing_comments());
          EXPECT_EQ(expected_trailing_comments, location->trailing_comments());
        }
        if (expected_leading_detached_comments == nullptr) {
          EXPECT_EQ(0, location->leading_detached_comments_size());
        } else {
          EXPECT_EQ(expected_leading_detached_comments,
                    absl::StrJoin(location->leading_detached_comments(), "\n"));
        }
        range.erase(iter);
        return true;
      }
    }

    return false;
  }